

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<3>::InnerLeaf<2>
          (InnerLeaf<3> *this,InnerLeaf<2> *other)

{
  const_iterator __n;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *__x;
  iterator __first;
  uint64_t *in_RSI;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffe0;
  
  Occupation::Occupation((Occupation *)in_RDI);
  *(uint64_t *)in_RDI = *in_RSI;
  *(int *)&(in_RDI->value_).coef = (int)in_RSI[1];
  __n = std::array<unsigned_long,_23UL>::cbegin((array<unsigned_long,_23UL> *)0x5fdc96);
  std::array<unsigned_long,_23UL>::cbegin((array<unsigned_long,_23UL> *)0x5fdca8);
  __x = (HighsHashTableEntry<int,_HighsImplications::VarBound> *)
        std::next<unsigned_long_const*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<unsigned_long,_39UL>::begin((array<unsigned_long,_39UL> *)0x5fdcd1);
  std::copy<unsigned_long_const*,unsigned_long*>
            (in_stack_ffffffffffffffe0,(unsigned_long *)in_RDI,(unsigned_long *)__x);
  __first = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
                      ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)
                       0x5fdcf3);
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)0x5fdd09);
  std::next<HighsHashTableEntry<int,HighsImplications::VarBound>*>(__x,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL> *)0x5fdd30);
  std::
  move<HighsHashTableEntry<int,HighsImplications::VarBound>*,HighsHashTableEntry<int,HighsImplications::VarBound>*>
            (__first,in_RDI,__x);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }